

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O0

int __thiscall cali::StringConverter::to_int(StringConverter *this,bool *okptr)

{
  int iVar1;
  int res;
  bool ok;
  bool *okptr_local;
  StringConverter *this_local;
  
  iVar1 = std::__cxx11::stoi(&this->m_str,(size_t *)0x0,10);
  if (okptr != (bool *)0x0) {
    *okptr = true;
  }
  return iVar1;
}

Assistant:

int cali::StringConverter::to_int(bool* okptr) const
{
    bool ok  = false;
    int  res = 0;

    try {
        res = std::stoi(m_str);
        ok  = true;
    } catch (...) {
        ok = false;
    }

    if (okptr)
        *okptr = ok;

    return res;
}